

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O1

void matras_create(matras *m,matras_id_t block_size,matras_allocator *allocator,matras_stats *stats)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  matras_id_t mVar5;
  matras_stats *pmVar6;
  uint uVar7;
  long *in_FS_OFFSET;
  
  uVar1 = allocator->extent_size;
  if ((uVar1 & uVar1 - 1) != 0) {
    __assert_fail("(extent_size & (extent_size - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x34,
                  "void matras_create(struct matras *, matras_id_t, struct matras_allocator *, struct matras_stats *)"
                 );
  }
  if ((block_size & block_size - 1) != 0) {
    __assert_fail("(block_size & (block_size - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x36,
                  "void matras_create(struct matras *, matras_id_t, struct matras_allocator *, struct matras_stats *)"
                 );
  }
  if (uVar1 < block_size) {
    __assert_fail("block_size <= extent_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x38,
                  "void matras_create(struct matras *, matras_id_t, struct matras_allocator *, struct matras_stats *)"
                 );
  }
  if (8 < uVar1) {
    (m->head).block_count = 0;
    (m->head).prev_view = (matras_view *)0x0;
    (m->head).next_view = (matras_view *)0x0;
    m->block_size = block_size;
    uVar3 = (uint)uVar1;
    m->extent_size = uVar3;
    m->extent_count = 0;
    m->allocator = allocator;
    pmVar6 = (matras_stats *)(*in_FS_OFFSET + -8);
    if (stats != (matras_stats *)0x0) {
      pmVar6 = stats;
    }
    m->stats = pmVar6;
    if ((uVar3 != 0) && (block_size != 0)) {
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar3 = 0x1f;
      if (block_size != 0) {
        for (; block_size >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar7 = ((uVar3 ^ 0x1f) + iVar2 * 3) - 0x25;
      uVar4 = 0x20;
      if (uVar7 < 0x20) {
        uVar4 = uVar7;
      }
      m->capacity = 1L << ((byte)uVar4 & 0x3f);
      mVar5 = ((uVar3 ^ 0x1f) + iVar2 * 2) - 0x22;
      m->shift1 = mVar5;
      m->shift2 = iVar2 - uVar3;
      m->mask1 = ~(-1 << ((byte)mVar5 & 0x1f));
      m->mask2 = ~(-1 << ((byte)(iVar2 - uVar3) & 0x1f));
      return;
    }
    __assert_fail("val > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x1c,"matras_id_t matras_log2(matras_id_t)");
  }
  __assert_fail("extent_size > sizeof(void *)",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                ,0x3a,
                "void matras_create(struct matras *, matras_id_t, struct matras_allocator *, struct matras_stats *)"
               );
}

Assistant:

void
matras_create(struct matras *m, matras_id_t block_size,
	      struct matras_allocator *allocator,
	      struct matras_stats *stats)
{
	size_t extent_size = allocator->extent_size;

	/*extent_size must be power of 2 */
	assert((extent_size & (extent_size - 1)) == 0);
	/*block_size must be power of 2 */
	assert((block_size & (block_size - 1)) == 0);
	/*block must be not greater than the extent*/
	assert(block_size <= extent_size);
	/*extent must be able to store at least two records*/
	assert(extent_size > sizeof(void *));

	m->head.block_count = 0;
	m->head.prev_view = 0;
	m->head.next_view = 0;
	m->block_size = block_size;
	m->extent_size = extent_size;
	m->extent_count = 0;
	m->allocator = allocator;
	m->stats = stats ? stats : &dummy_stats;

	matras_id_t log1 = matras_log2(extent_size);
	matras_id_t log2 = matras_log2(block_size);
	matras_id_t log3 = matras_log2(sizeof(void *));
	matras_id_t log2_capacity = log1 * 3 - log2 - log3 * 2;
	/*
	 * Given 32-bit block identifiers, the maximum possible number of
	 * provided blocks is 2^32.
	 */
	if (log2_capacity > 32)
		log2_capacity = 32;
	m->capacity = (size_t)1 << log2_capacity;
	m->shift1 = log1 * 2 - log2 - log3;
	m->shift2 = log1 - log2;
	m->mask1 = (((matras_id_t)1) << m->shift1) - ((matras_id_t)1);
	m->mask2 = (((matras_id_t)1) << m->shift2) - ((matras_id_t)1);
}